

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

word * capnp::_::WireHelpers::copyMessage
                 (SegmentBuilder **segment,CapTableBuilder *capTable,WirePointer **dst,
                 WirePointer *src)

{
  ushort uVar1;
  uint uVar2;
  BuilderArena *pBVar3;
  Exception *pEVar4;
  byte bVar5;
  uint uVar6;
  SegmentBuilder *pSVar7;
  WirePointer *pWVar8;
  WirePointer *pWVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  bool bVar13;
  AllocateResult AVar14;
  SegmentBuilder *subSegment;
  WirePointer *dstRef;
  Fault local_80;
  WirePointer *local_78;
  CapTableBuilder *local_70;
  WirePointer *local_68;
  WirePointer *local_60;
  WirePointer *local_58;
  SegmentBuilder **local_50;
  uint local_44;
  WirePointer *local_40;
  ulong local_38;
  
  uVar6 = (src->offsetAndKind).value;
  iVar12 = (int)uVar6 >> 2;
  local_70 = capTable;
  local_68 = (WirePointer *)dst;
  switch(uVar6 & 3) {
  case 0:
    uVar2 = (src->field_1).upper32Bits;
    if (uVar2 == 0 && uVar6 == 0) {
      pWVar9 = *dst;
      pWVar9->offsetAndKind = 0;
      pWVar9->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
      return (word *)0x0;
    }
    uVar6 = (uVar2 & 0xffff) + (uVar2 >> 0x10);
    pWVar9 = *dst;
    if ((pWVar9->field_1).upper32Bits != 0 || (pWVar9->offsetAndKind).value != 0) {
      zeroObject(*segment,capTable,pWVar9);
    }
    if (uVar6 == 0) {
      local_78 = *dst;
      (local_78->offsetAndKind).value = 0xfffffffc;
    }
    else {
      pSVar7 = *segment;
      local_78 = (WirePointer *)pSVar7->pos;
      if ((long)(ulong)uVar6 <=
          (long)((long)(pSVar7->super_SegmentReader).ptr.ptr +
                ((pSVar7->super_SegmentReader).ptr.size_ * 8 - (long)local_78)) >> 3) {
        pSVar7->pos = (word *)(local_78 + uVar6);
        if (local_78 != (WirePointer *)0x0) {
          ((*dst)->offsetAndKind).value =
               ((uint)((ulong)((long)local_78 - (long)*dst) >> 1) & 0xfffffffc) - 4;
          goto LAB_001f6b9a;
        }
        pSVar7 = *segment;
      }
      pBVar3 = (BuilderArena *)(pSVar7->super_SegmentReader).arena;
      uVar6 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::allocate(capnp::_::WirePointer*&,capnp::_::SegmentBuilder*&,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::WirePointer::Kind,capnp::_::BuilderArena*)::_lambda()_1_>
                        (uVar6 + 1,(anon_class_1_0_00000001 *)&local_80);
      AVar14 = BuilderArena::allocate(pBVar3,uVar6);
      local_78 = (WirePointer *)AVar14.words;
      pSVar7 = AVar14.segment;
      *segment = pSVar7;
      pWVar9 = *dst;
      (pWVar9->offsetAndKind).value =
           (int)AVar14.words - *(int *)&(pSVar7->super_SegmentReader).ptr.ptr & 0xfffffff8U | 2;
      pWVar9->field_1 =
           (anon_union_4_5_35ddcec3_for_WirePointer_1)(pSVar7->super_SegmentReader).id.value;
      *dst = local_78;
      (local_78->offsetAndKind).value = 0;
      local_78 = local_78 + 1;
    }
LAB_001f6b9a:
    pWVar9 = local_78;
    pEVar4 = (Exception *)*segment;
    uVar1 = *(ushort *)&src->field_1;
    uVar6 = (uint)uVar1;
    uVar11 = (ulong)(src->field_1).structRef.ptrCount.value;
    if (uVar1 == 0) {
      uVar6 = 0;
    }
    else {
      memcpy(local_78,src + (long)iVar12 + 1,(ulong)((uint)uVar1 * 8));
    }
    pWVar8 = (WirePointer *)((long)&src[(long)iVar12 + 1].offsetAndKind.value + (ulong)(uVar6 << 3))
    ;
    pWVar9 = (WirePointer *)((long)&(pWVar9->offsetAndKind).value + (ulong)(uVar6 << 3));
    while (bVar13 = uVar11 != 0, uVar11 = uVar11 - 1, bVar13) {
      local_80.exception = pEVar4;
      local_60 = pWVar9;
      copyMessage((SegmentBuilder **)&local_80,local_70,&local_60,pWVar8);
      pWVar9 = pWVar9 + 1;
      pWVar8 = pWVar8 + 1;
    }
    (*(WirePointer **)local_68)->field_1 = src->field_1;
    return (word *)local_78;
  case 2:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[48]>
              (&local_80,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,0x3ee,FAILED,(char *)0x0,"\"Unchecked messages cannot contain far pointers.\"",
               (char (*) [48])"Unchecked messages cannot contain far pointers.");
    kj::_::Debug::Fault::fatal(&local_80);
  case 3:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[70]>
              (&local_80,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,0x3eb,FAILED,(char *)0x0,
               "\"Unchecked messages cannot contain OTHER pointers (e.g. capabilities).\"",
               (char (*) [70])
               "Unchecked messages cannot contain OTHER pointers (e.g. capabilities).");
    kj::_::Debug::Fault::fatal(&local_80);
  }
  uVar6 = (src->field_1).upper32Bits;
  bVar5 = (byte)uVar6 & 7;
  if (5 < bVar5) {
    local_50 = segment;
    if ((uVar6 & 7) != 6) {
      uVar6 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::copyMessage(capnp::_::SegmentBuilder*&,capnp::_::CapTableBuilder*,capnp::_::WirePointer*&,capnp::_::WirePointer_const*)::_lambda()_1_>
                        ((uVar6 >> 3) + 1,(anon_class_1_0_00000001 *)&local_60);
      pWVar9 = *dst;
      if ((pWVar9->field_1).upper32Bits != 0 || (pWVar9->offsetAndKind).value != 0) {
        zeroObject(*segment,local_70,pWVar9);
      }
      local_40 = src + (long)iVar12 + 1;
      pSVar7 = *segment;
      local_78 = (WirePointer *)pSVar7->pos;
      if ((long)(ulong)uVar6 <=
          (long)((long)(pSVar7->super_SegmentReader).ptr.ptr +
                ((pSVar7->super_SegmentReader).ptr.size_ * 8 - (long)local_78)) >> 3) {
        pSVar7->pos = (word *)(local_78 + uVar6);
        if (local_78 != (WirePointer *)0x0) {
          pWVar9 = *dst;
          (pWVar9->offsetAndKind).value =
               ((uint)((ulong)((long)local_78 - (long)pWVar9) >> 1) & 0xfffffffc) - 3;
          goto LAB_001f6d84;
        }
        pSVar7 = *segment;
      }
      pBVar3 = (BuilderArena *)(pSVar7->super_SegmentReader).arena;
      uVar6 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::allocate(capnp::_::WirePointer*&,capnp::_::SegmentBuilder*&,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::WirePointer::Kind,capnp::_::BuilderArena*)::_lambda()_1_>
                        (uVar6 + 1,(anon_class_1_0_00000001 *)&local_80);
      AVar14 = BuilderArena::allocate(pBVar3,uVar6);
      pWVar9 = (WirePointer *)AVar14.words;
      pSVar7 = AVar14.segment;
      *segment = pSVar7;
      pWVar8 = *dst;
      (pWVar8->offsetAndKind).value =
           (int)AVar14.words - *(int *)&(pSVar7->super_SegmentReader).ptr.ptr & 0xfffffff8U | 2;
      pWVar8->field_1 =
           (anon_union_4_5_35ddcec3_for_WirePointer_1)(pSVar7->super_SegmentReader).id.value;
      *dst = pWVar9;
      (pWVar9->offsetAndKind).value = 1;
      local_78 = pWVar9 + 1;
LAB_001f6d84:
      (pWVar9->field_1).upper32Bits = (src->field_1).upper32Bits | 7;
      *local_78 = *local_40;
      uVar6 = (local_40->offsetAndKind).value;
      if ((uVar6 & 3) == 0) {
        local_68 = local_78 + 1;
        local_58 = local_40 + 1;
        local_44 = uVar6 >> 2 & 0x1fffffff;
        for (local_38 = 0; pWVar9 = local_58, (uint)local_38 != local_44;
            local_38 = (ulong)((int)local_38 + 1)) {
          pEVar4 = (Exception *)*segment;
          uVar1 = *(ushort *)&local_40->field_1;
          uVar6 = (uint)uVar1;
          uVar11 = (ulong)(local_40->field_1).structRef.ptrCount.value;
          if (uVar1 == 0) {
            uVar6 = 0;
          }
          else {
            memcpy(local_68,local_58,(ulong)((uint)uVar1 * 8));
          }
          pWVar8 = (WirePointer *)((long)&(pWVar9->offsetAndKind).value + (ulong)(uVar6 << 3));
          pWVar9 = (WirePointer *)((long)&(local_68->offsetAndKind).value + (ulong)(uVar6 << 3));
          while (bVar13 = uVar11 != 0, uVar11 = uVar11 - 1, bVar13) {
            local_80.exception = pEVar4;
            local_60 = pWVar9;
            copyMessage((SegmentBuilder **)&local_80,local_70,&local_60,pWVar8);
            pWVar9 = pWVar9 + 1;
            pWVar8 = pWVar8 + 1;
          }
          uVar11 = (ulong)(((uint)(local_40->field_1).structRef.ptrCount.value +
                           (uint)(local_40->field_1).structRef.dataSize.value) * 8);
          local_58 = (WirePointer *)((long)&(local_58->offsetAndKind).value + uVar11);
          local_68 = (WirePointer *)((long)&(local_68->offsetAndKind).value + uVar11);
          segment = local_50;
        }
        return (word *)local_78;
      }
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[48]>
                (&local_80,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x3dd,FAILED,"srcTag->kind() == WirePointer::STRUCT",
                 "\"INLINE_COMPOSITE of lists is not yet supported.\"",
                 (char (*) [48])"INLINE_COMPOSITE of lists is not yet supported.");
      kj::_::Debug::Fault::fatal(&local_80);
    }
    uVar6 = uVar6 >> 3;
    pWVar9 = *dst;
    if ((pWVar9->field_1).upper32Bits != 0 || (pWVar9->offsetAndKind).value != 0) {
      zeroObject(*segment,capTable,pWVar9);
    }
    pSVar7 = *segment;
    pWVar9 = (WirePointer *)pSVar7->pos;
    if ((long)(ulong)uVar6 <=
        (long)((long)(pSVar7->super_SegmentReader).ptr.ptr +
              ((pSVar7->super_SegmentReader).ptr.size_ * 8 - (long)pWVar9)) >> 3) {
      pSVar7->pos = (word *)(pWVar9 + uVar6);
      if (pWVar9 != (WirePointer *)0x0) {
        ((*dst)->offsetAndKind).value =
             ((uint)((ulong)((long)pWVar9 - (long)*dst) >> 1) & 0xfffffffc) - 3;
        goto LAB_001f6cba;
      }
      pSVar7 = *local_50;
    }
    pBVar3 = (BuilderArena *)(pSVar7->super_SegmentReader).arena;
    uVar6 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::allocate(capnp::_::WirePointer*&,capnp::_::SegmentBuilder*&,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::WirePointer::Kind,capnp::_::BuilderArena*)::_lambda()_1_>
                      (uVar6 + 1,(anon_class_1_0_00000001 *)&local_80);
    AVar14 = BuilderArena::allocate(pBVar3,uVar6);
    pWVar9 = (WirePointer *)AVar14.words;
    pSVar7 = AVar14.segment;
    *local_50 = pSVar7;
    pWVar8 = *dst;
    (pWVar8->offsetAndKind).value =
         (int)AVar14.words - *(int *)&(pSVar7->super_SegmentReader).ptr.ptr & 0xfffffff8U | 2;
    pWVar8->field_1 =
         (anon_union_4_5_35ddcec3_for_WirePointer_1)(pSVar7->super_SegmentReader).id.value;
    *dst = pWVar9;
    (pWVar9->offsetAndKind).value = 1;
    pWVar9 = pWVar9 + 1;
LAB_001f6cba:
    uVar6 = (src->field_1).upper32Bits;
    local_58 = src;
    for (uVar11 = 0; (uVar6 & 0xfffffff8) != uVar11; uVar11 = uVar11 + 8) {
      local_80.exception = (Exception *)*local_50;
      local_60 = (WirePointer *)((long)&(pWVar9->offsetAndKind).value + uVar11);
      copyMessage((SegmentBuilder **)&local_80,local_70,&local_60,
                  (WirePointer *)((long)&src[(long)iVar12 + 1].offsetAndKind.value + uVar11));
    }
    ((*(WirePointer **)local_68)->field_1).upper32Bits =
         (local_58->field_1).upper32Bits & 0xfffffff8 | 6;
    return (word *)pWVar9;
  }
  uVar11 = (ulong)*(uint *)(BITS_PER_ELEMENT_TABLE + (ulong)bVar5 * 4) * (ulong)(uVar6 >> 3) + 0x3f
           >> 6;
  pWVar9 = *dst;
  if ((pWVar9->field_1).upper32Bits != 0 || (pWVar9->offsetAndKind).value != 0) {
    zeroObject(*segment,capTable,pWVar9);
  }
  pSVar7 = *segment;
  pWVar9 = (WirePointer *)pSVar7->pos;
  iVar10 = (int)uVar11;
  uVar11 = uVar11 & 0xffffffff;
  if ((long)uVar11 <=
      (long)((long)(pSVar7->super_SegmentReader).ptr.ptr +
            ((pSVar7->super_SegmentReader).ptr.size_ * 8 - (long)pWVar9)) >> 3) {
    pSVar7->pos = (word *)(pWVar9 + uVar11);
    if (pWVar9 != (WirePointer *)0x0) {
      pWVar8 = *dst;
      (pWVar8->offsetAndKind).value =
           ((uint)((ulong)((long)pWVar9 - (long)pWVar8) >> 1) & 0xfffffffc) - 3;
      goto LAB_001f6aac;
    }
    pSVar7 = *segment;
  }
  pBVar3 = (BuilderArena *)(pSVar7->super_SegmentReader).arena;
  uVar6 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::allocate(capnp::_::WirePointer*&,capnp::_::SegmentBuilder*&,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::WirePointer::Kind,capnp::_::BuilderArena*)::_lambda()_1_>
                    (iVar10 + 1,(anon_class_1_0_00000001 *)&local_80);
  AVar14 = BuilderArena::allocate(pBVar3,uVar6);
  pWVar8 = (WirePointer *)AVar14.words;
  pSVar7 = AVar14.segment;
  *segment = pSVar7;
  pWVar9 = *dst;
  (pWVar9->offsetAndKind).value =
       (int)AVar14.words - *(int *)&(pSVar7->super_SegmentReader).ptr.ptr & 0xfffffff8U | 2;
  pWVar9->field_1 =
       (anon_union_4_5_35ddcec3_for_WirePointer_1)(pSVar7->super_SegmentReader).id.value;
  *dst = pWVar8;
  (pWVar8->offsetAndKind).value = 1;
  pWVar9 = pWVar8 + 1;
LAB_001f6aac:
  if (iVar10 != 0) {
    memcpy(pWVar9,src + (long)iVar12 + 1,(ulong)(uint)(iVar10 << 3));
    pWVar8 = *dst;
  }
  pWVar8->field_1 = src->field_1;
  return (word *)pWVar9;
}

Assistant:

static word* copyMessage(
      SegmentBuilder*& segment, CapTableBuilder* capTable,
      WirePointer*& dst, const WirePointer* src) {
    // Not always-inline because it's recursive.

    switch (src->kind()) {
      case WirePointer::STRUCT: {
        if (src->isNull()) {
          zeroMemory(dst);
          return nullptr;
        } else {
          const word* srcPtr = src->target(nullptr);
          word* dstPtr = allocate(
              dst, segment, capTable, src->structRef.wordSize(), WirePointer::STRUCT, nullptr);

          copyStruct(segment, capTable, dstPtr, srcPtr, src->structRef.dataSize.get(),
                     src->structRef.ptrCount.get());

          dst->structRef.set(src->structRef.dataSize.get(), src->structRef.ptrCount.get());
          return dstPtr;
        }
      }
      case WirePointer::LIST: {
        switch (src->listRef.elementSize()) {
          case ElementSize::VOID:
          case ElementSize::BIT:
          case ElementSize::BYTE:
          case ElementSize::TWO_BYTES:
          case ElementSize::FOUR_BYTES:
          case ElementSize::EIGHT_BYTES: {
            auto wordCount = roundBitsUpToWords(
                upgradeBound<uint64_t>(src->listRef.elementCount()) *
                dataBitsPerElement(src->listRef.elementSize()));
            const word* srcPtr = src->target(nullptr);
            word* dstPtr = allocate(dst, segment, capTable, wordCount, WirePointer::LIST, nullptr);
            copyMemory(dstPtr, srcPtr, wordCount);

            dst->listRef.set(src->listRef.elementSize(), src->listRef.elementCount());
            return dstPtr;
          }

          case ElementSize::POINTER: {
            const WirePointer* srcRefs = reinterpret_cast<const WirePointer*>(src->target(nullptr));
            WirePointer* dstRefs = reinterpret_cast<WirePointer*>(
                allocate(dst, segment, capTable, src->listRef.elementCount() *
                    (ONE * POINTERS / ELEMENTS) * WORDS_PER_POINTER,
                    WirePointer::LIST, nullptr));

            for (auto i: kj::zeroTo(src->listRef.elementCount() * (ONE * POINTERS / ELEMENTS))) {
              SegmentBuilder* subSegment = segment;
              WirePointer* dstRef = dstRefs + i;
              copyMessage(subSegment, capTable, dstRef, srcRefs + i);
            }

            dst->listRef.set(ElementSize::POINTER, src->listRef.elementCount());
            return reinterpret_cast<word*>(dstRefs);
          }

          case ElementSize::INLINE_COMPOSITE: {
            const word* srcPtr = src->target(nullptr);
            word* dstPtr = allocate(dst, segment, capTable,
                assertMaxBits<SEGMENT_WORD_COUNT_BITS>(
                    src->listRef.inlineCompositeWordCount() + POINTER_SIZE_IN_WORDS,
                    []() { KJ_FAIL_ASSERT("list too big to fit in a segment"); }),
                WirePointer::LIST, nullptr);

            dst->listRef.setInlineComposite(src->listRef.inlineCompositeWordCount());

            const WirePointer* srcTag = reinterpret_cast<const WirePointer*>(srcPtr);
            copyMemory(reinterpret_cast<WirePointer*>(dstPtr), srcTag);

            const word* srcElement = srcPtr + POINTER_SIZE_IN_WORDS;
            word* dstElement = dstPtr + POINTER_SIZE_IN_WORDS;

            KJ_ASSERT(srcTag->kind() == WirePointer::STRUCT,
                "INLINE_COMPOSITE of lists is not yet supported.");

            for (auto i KJ_UNUSED: kj::zeroTo(srcTag->inlineCompositeListElementCount())) {
              copyStruct(segment, capTable, dstElement, srcElement,
                  srcTag->structRef.dataSize.get(), srcTag->structRef.ptrCount.get());
              srcElement += srcTag->structRef.wordSize();
              dstElement += srcTag->structRef.wordSize();
            }
            return dstPtr;
          }
        }
        break;
      }
      case WirePointer::OTHER:
        KJ_FAIL_REQUIRE("Unchecked messages cannot contain OTHER pointers (e.g. capabilities).");
        break;
      case WirePointer::FAR:
        KJ_FAIL_REQUIRE("Unchecked messages cannot contain far pointers.");
        break;
    }

    return nullptr;
  }